

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadUnix.c
# Opt level: O0

void deSleep(deUint32 milliseconds)

{
  deUint32 seconds;
  deUint32 milliseconds_local;
  
  if (milliseconds / 1000 != 0) {
    sleep(milliseconds / 1000);
  }
  usleep((milliseconds % 1000) * 1000);
  return;
}

Assistant:

void deSleep (deUint32 milliseconds)
{
	/* Maximum value for usleep is 10^6. */
	deUint32 seconds = milliseconds / 1000;

	milliseconds = milliseconds - seconds * 1000;

	if (seconds > 0)
		sleep(seconds);

	usleep((useconds_t)milliseconds * (useconds_t)1000);
}